

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O3

array<unsigned_short,_5UL> __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<int>>::readPattern<std::array<unsigned_short,5ul>>
          (BitMatrixCursor<ZXing::PointT<int>> *this,int range)

{
  uint uVar1;
  array<unsigned_short,_5UL> *__range3;
  long lVar2;
  array<unsigned_short,_5UL> aVar3;
  array<unsigned_short,_5UL> res;
  undefined8 local_28;
  unsigned_short local_20;
  
  local_20 = 0;
  local_28 = 0;
  lVar2 = 0;
  do {
    uVar1 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                      ((BitMatrixCursor<ZXing::PointT<int>_> *)this,1,range,false);
    *(short *)((long)&local_28 + lVar2) = (short)uVar1;
    if ((short)uVar1 == 0) break;
    if (range != 0) {
      range = range - (uVar1 & 0xffff);
    }
    lVar2 = lVar2 + 2;
  } while (lVar2 != 10);
  aVar3._M_elems[0] = (undefined2)local_28;
  aVar3._M_elems[1] = local_28._2_2_;
  aVar3._M_elems[2] = local_28._4_2_;
  aVar3._M_elems[3] = local_28._6_2_;
  aVar3._M_elems[4] = local_20;
  return (array<unsigned_short,_5UL>)aVar3._M_elems;
}

Assistant:

ARRAY readPattern(int range = 0)
	{
		ARRAY res = {};
		for (auto& i : res) {
			i = stepToEdge(1, range);
			if (!i)
				return res;
			if (range)
				range -= i;
		}
		return res;
	}